

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_wrapper.hpp
# Opt level: O0

box<float,_784UL> * __thiscall
pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>::
compute_bounding_box
          (space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
           *this)

{
  box_base<pico_tree::internal::box<float,_784UL>_> *pbVar1;
  space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_> *in_RSI;
  box<float,_784UL> *in_RDI;
  box<float,_784UL> *bbox;
  size_type i;
  unsigned_long in_stack_ffffffffffffffc8;
  size_type in_stack_ffffffffffffffd0;
  box<float,_784UL> *x;
  box_base<pico_tree::internal::box<float,_784UL>_> *this_00;
  box_base<pico_tree::internal::box<float,_784UL>_> *this_01;
  
  x = in_RDI;
  sdim(in_RSI);
  box_base<pico_tree::internal::box<float,_784UL>_>::make_inverse_max(in_stack_ffffffffffffffd0);
  this_00 = (box_base<pico_tree::internal::box<float,_784UL>_> *)0x0;
  while( true ) {
    this_01 = this_00;
    pbVar1 = (box_base<pico_tree::internal::box<float,_784UL>_> *)
             size((space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
                   *)0x110e5c);
    if (pbVar1 <= this_00) break;
    operator[]<unsigned_long>
              ((space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>
                *)this_00,in_stack_ffffffffffffffc8);
    box_base<pico_tree::internal::box<float,_784UL>_>::fit(this_01,(scalar_type *)x);
    this_00 = this_01 + 1;
  }
  return in_RDI;
}

Assistant:

inline box<scalar_type, dim> compute_bounding_box() const {
    auto bbox = box<scalar_type, dim>::make_inverse_max(sdim());
    for (size_type i = 0; i < size(); ++i) {
      bbox.fit(operator[](i));
    }
    return bbox;
  }